

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

int utils::scanDir(string *path,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *ret)

{
  char *__name;
  DIR *__dirp;
  dirent *pdVar1;
  size_type sVar2;
  allocator local_b9;
  string local_b8 [32];
  char local_98 [8];
  char s [100];
  dirent *rent;
  DIR *dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ret_local;
  string *path_local;
  
  __name = (char *)std::__cxx11::string::c_str();
  __dirp = opendir(__name);
  while (pdVar1 = readdir(__dirp), pdVar1 != (dirent *)0x0) {
    strcpy(local_98,pdVar1->d_name);
    if (local_98[0] != '.') {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b8,local_98,&local_b9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(ret,(value_type *)local_b8);
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    }
  }
  closedir(__dirp);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(ret);
  return (int)sVar2;
}

Assistant:

static inline int scanDir(std::string path, std::vector<std::string> &ret) {
  DIR *dir;
  struct dirent *rent;
  dir = opendir(path.c_str());
  char s[100];
  while ((rent = readdir(dir))) {
    strcpy(s, rent->d_name);
    if (s[0] != '.') {
      ret.push_back(s);
    }
  }
  closedir(dir);
  return ret.size();
}